

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::bindTexture(ReferenceContext *this,deUint32 target,deUint32 texture)

{
  int unitNdx;
  TextureCube *this_00;
  uint uVar1;
  short sVar2;
  Type TStack_40;
  
  unitNdx = this->m_activeTexture;
  if (((((1 < target - 0xde0) && (target != 0x806f)) && (target != 0x8513)) &&
      ((target != 0x8c1a && (target != 0x9009)))) ||
     ((target == 0xde0 && (((this->m_limits).contextType.super_ApiType.m_bits & 0x300) == 0)))) {
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
    }
    return;
  }
  sVar2 = (short)target;
  if (texture == 0) {
    if (sVar2 != -0x6ff7) {
      uVar1 = target & 0xffff;
      if (uVar1 == 0xde1) {
        this_00 = (TextureCube *)0x0;
        goto LAB_00884272;
      }
      if (uVar1 == 0x806f) {
        this_00 = (TextureCube *)0x0;
        goto LAB_0088421b;
      }
      if (uVar1 == 0x8513) {
        this_00 = (TextureCube *)0x0;
        goto LAB_00884255;
      }
      if (uVar1 == 0x8c1a) {
        this_00 = (TextureCube *)0x0;
        goto LAB_00884238;
      }
      if (uVar1 != 0xde0) {
        return;
      }
      this_00 = (TextureCube *)0x0;
      goto LAB_008841fe;
    }
    this_00 = (TextureCube *)0x0;
  }
  else {
    this_00 = (TextureCube *)rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,texture);
    uVar1 = target & 0xffff;
    if (this_00 == (TextureCube *)0x0) {
      if (sVar2 == -0x6ff7) {
        this_00 = (TextureCube *)operator_new(0x5b0);
        rc::TextureCubeArray::TextureCubeArray((TextureCubeArray *)this_00,texture);
      }
      else if (uVar1 == 0xde1) {
        this_00 = (TextureCube *)operator_new(0x5b0);
        rc::Texture2D::Texture2D((Texture2D *)this_00,texture);
      }
      else if (uVar1 == 0x806f) {
        this_00 = (TextureCube *)operator_new(0x5b0);
        rc::Texture3D::Texture3D((Texture3D *)this_00,texture);
      }
      else if (uVar1 == 0x8513) {
        this_00 = (TextureCube *)operator_new(0x2018);
        rc::TextureCube::TextureCube(this_00,texture);
      }
      else if (uVar1 == 0x8c1a) {
        this_00 = (TextureCube *)operator_new(0x5b0);
        rc::Texture2DArray::Texture2DArray((Texture2DArray *)this_00,texture);
      }
      else if (uVar1 == 0xde0) {
        this_00 = (TextureCube *)operator_new(0x5b0);
        rc::Texture1D::Texture1D((Texture1D *)this_00,texture);
      }
      else {
        this_00 = (TextureCube *)0x0;
      }
      rc::ObjectManager<sglr::rc::Texture>::insert(&this->m_textures,&this_00->super_Texture);
    }
    else {
      if (sVar2 == -0x6ff7) {
        TStack_40 = TYPE_CUBE_MAP_ARRAY;
      }
      else if (uVar1 == 0xde1) {
        TStack_40 = TYPE_2D;
      }
      else if (uVar1 == 0x806f) {
        TStack_40 = TYPE_3D;
      }
      else if (uVar1 == 0x8513) {
        TStack_40 = TYPE_CUBE_MAP;
      }
      else if (uVar1 == 0x8c1a) {
        TStack_40 = TYPE_2D_ARRAY;
      }
      else if (uVar1 == 0xde0) {
        TStack_40 = TYPE_1D;
      }
      else {
        TStack_40 = TYPE_LAST;
      }
      if ((this_00->super_Texture).m_type != TStack_40) {
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x502;
        return;
      }
    }
    if (sVar2 != -0x6ff7) {
      if (uVar1 == 0xde1) {
LAB_00884272:
        setTex2DBinding(this,unitNdx,(Texture2D *)this_00);
        return;
      }
      if (uVar1 == 0x806f) {
LAB_0088421b:
        setTex3DBinding(this,unitNdx,(Texture3D *)this_00);
        return;
      }
      if (uVar1 == 0x8513) {
LAB_00884255:
        setTexCubeBinding(this,unitNdx,this_00);
        return;
      }
      if (uVar1 == 0x8c1a) {
LAB_00884238:
        setTex2DArrayBinding(this,unitNdx,(Texture2DArray *)this_00);
        return;
      }
      if (uVar1 != 0xde0) {
        return;
      }
LAB_008841fe:
      setTex1DBinding(this,unitNdx,(Texture1D *)this_00);
      return;
    }
  }
  setTexCubeArrayBinding(this,unitNdx,(TextureCubeArray *)this_00);
  return;
}

Assistant:

void ReferenceContext::bindTexture (deUint32 target, deUint32 texture)
{
	int unitNdx = m_activeTexture;

	RC_IF_ERROR(target != GL_TEXTURE_1D				&&
				target != GL_TEXTURE_2D				&&
				target != GL_TEXTURE_CUBE_MAP		&&
				target != GL_TEXTURE_2D_ARRAY		&&
				target != GL_TEXTURE_3D				&&
				target != GL_TEXTURE_CUBE_MAP_ARRAY,
				GL_INVALID_ENUM, RC_RET_VOID);

	RC_IF_ERROR(glu::isContextTypeES(m_limits.contextType) && (target == GL_TEXTURE_1D), GL_INVALID_ENUM, RC_RET_VOID);

	if (texture == 0)
	{
		// Clear binding.
		switch (target)
		{
			case GL_TEXTURE_1D:				setTex1DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_2D:				setTex2DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_CUBE_MAP:		setTexCubeBinding		(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_2D_ARRAY:		setTex2DArrayBinding	(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_3D:				setTex3DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_CUBE_MAP_ARRAY:	setTexCubeArrayBinding	(unitNdx, DE_NULL);	break;
			default:
				DE_ASSERT(false);
		}
	}
	else
	{
		Texture* texObj = m_textures.find(texture);

		if (texObj)
		{
			// Validate type.
			Texture::Type expectedType = Texture::TYPE_LAST;
			switch (target)
			{
				case GL_TEXTURE_1D:				expectedType = Texture::TYPE_1D;				break;
				case GL_TEXTURE_2D:				expectedType = Texture::TYPE_2D;				break;
				case GL_TEXTURE_CUBE_MAP:		expectedType = Texture::TYPE_CUBE_MAP;			break;
				case GL_TEXTURE_2D_ARRAY:		expectedType = Texture::TYPE_2D_ARRAY;			break;
				case GL_TEXTURE_3D:				expectedType = Texture::TYPE_3D;				break;
				case GL_TEXTURE_CUBE_MAP_ARRAY:	expectedType = Texture::TYPE_CUBE_MAP_ARRAY;	break;
				default:
					DE_ASSERT(false);
			}
			RC_IF_ERROR(texObj->getType() != expectedType, GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
		{
			// New texture object.
			switch (target)
			{
				case GL_TEXTURE_1D:				texObj = new Texture1D			(texture);	break;
				case GL_TEXTURE_2D:				texObj = new Texture2D			(texture);	break;
				case GL_TEXTURE_CUBE_MAP:		texObj = new TextureCube		(texture);	break;
				case GL_TEXTURE_2D_ARRAY:		texObj = new Texture2DArray		(texture);	break;
				case GL_TEXTURE_3D:				texObj = new Texture3D			(texture);	break;
				case GL_TEXTURE_CUBE_MAP_ARRAY:	texObj = new TextureCubeArray	(texture);	break;
				default:
					DE_ASSERT(false);
			}

			m_textures.insert(texObj);
		}

		switch (target)
		{
			case GL_TEXTURE_1D:				setTex1DBinding			(unitNdx, static_cast<Texture1D*>			(texObj));	break;
			case GL_TEXTURE_2D:				setTex2DBinding			(unitNdx, static_cast<Texture2D*>			(texObj));	break;
			case GL_TEXTURE_CUBE_MAP:		setTexCubeBinding		(unitNdx, static_cast<TextureCube*>			(texObj));	break;
			case GL_TEXTURE_2D_ARRAY:		setTex2DArrayBinding	(unitNdx, static_cast<Texture2DArray*>		(texObj));	break;
			case GL_TEXTURE_3D:				setTex3DBinding			(unitNdx, static_cast<Texture3D*>			(texObj));	break;
			case GL_TEXTURE_CUBE_MAP_ARRAY:	setTexCubeArrayBinding	(unitNdx, static_cast<TextureCubeArray*>	(texObj));	break;
			default:
				DE_ASSERT(false);
		}
	}
}